

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O3

void __thiscall
Synthesizer::Voice::NoteOn(Voice *this,int note,int velocity,float *p,float sampletime)

{
  int i;
  long lVar1;
  uint uVar2;
  float fVar3;
  
  this->aenv = 1.0;
  this->aenvdecay = 1.0;
  this->fenv = 1.0;
  fVar3 = powf(0.0001,sampletime / p[4]);
  this->fenvdecay = fVar3;
  this->amp = (float)velocity * 0.007874016;
  this->rampcount = 0;
  this->channels[0].phase[0] = 0;
  this->channels[0].phase[1] = 0;
  this->channels[0].phase[2] = 0;
  this->channels[0].phase[3] = 0;
  this->channels[0].phase[4] = 0;
  this->channels[0].phase[5] = 0;
  this->channels[0].phase[6] = 0;
  *(undefined8 *)(this->channels[0].phase + 7) = 0;
  this->channels[0].detune = 0;
  this->channels[0].mask = 0;
  this->channels[0].lpf = 0.0;
  this->channels[0].bpf = 0.0;
  this->channels[1].phase[0] = 0;
  this->channels[1].phase[1] = 0;
  this->channels[1].phase[2] = 0;
  this->channels[1].phase[3] = 0;
  this->channels[1].phase[4] = 0;
  this->channels[1].phase[5] = 0;
  this->channels[1].phase[6] = 0;
  this->channels[1].phase[7] = 0;
  this->channels[1].freq = 0;
  this->channels[1].detune = 0;
  this->channels[1].detune = 0;
  this->channels[1].mask = 0;
  this->channels[1].lpf = 0.0;
  this->channels[1].bpf = 0.0;
  this->p = p;
  this->sampletime = sampletime;
  this->note = (float)note;
  lVar1 = 0;
  do {
    uVar2 = (this->random).seed * 0x19660d + 0x3c6ef35f;
    (this->random).seed = uVar2;
    this->channels[0].phase[lVar1] = uVar2 >> 0x10 ^ uVar2;
    uVar2 = (this->random).seed * 0x19660d + 0x3c6ef35f;
    (this->random).seed = uVar2;
    this->channels[1].phase[lVar1] = uVar2 >> 0x10 ^ uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void NoteOn(int note, int velocity, float* p, float sampletime)
        {
            aenv = 1.0f;
            aenvdecay = 1.0f;
            fenv = 1.0f;
            fenvdecay = powf(0.0001f, sampletime / p[P_DECAY]);
            amp = velocity * ONE_OVER_127;
            rampcount = 0;
            channels[0].Reset();
            channels[1].Reset();
            this->p = p;
            this->sampletime = sampletime;
            this->note = note;
            for (int i = 0; i < MAXOSCILLATORS; i++)
            {
                channels[0].phase[i] = random.Get();
                channels[1].phase[i] = random.Get();
            }
        }